

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvavucstart.c
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  long lVar4;
  uint32_t word;
  uint uVar5;
  int cnum;
  int local_3c;
  int local_38;
  uint local_34;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    local_3c = 0;
    local_38 = 1;
    local_34 = 1;
    do {
      while( true ) {
        while( true ) {
          iVar2 = getopt(argc,argv,"c:bvu");
          if (iVar2 < 99) break;
          if (iVar2 == 99) {
            __isoc99_sscanf(_optarg,"%d",&local_3c);
          }
          else if (iVar2 == 0x75) {
            local_38 = 0;
          }
        }
        if (iVar2 != 0x62) break;
        local_34 = 0;
      }
    } while (iVar2 != -1);
    if (local_3c < nva_cardsnum) {
      if ((local_34 & 1) == 0) {
        if (_optind < argc) {
          __stream = fopen(argv[_optind],"rb");
          if (__stream != (FILE *)0x0) {
            fprintf(_stderr,"Uploading file %s.\n",argv[_optind]);
            uVar5 = 0x10000;
            lVar4 = 0x103288;
            do {
              pvVar1 = nva_cards[local_3c]->bar0;
              *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
              *(uint *)((long)pvVar1 + lVar4) = uVar5;
              iVar2 = 0;
              uVar5 = 0;
              do {
                uVar3 = fgetc(__stream);
                if (uVar3 == 0xffffffff) {
                  if (iVar2 != 0) {
                    pvVar1 = nva_cards[local_3c]->bar0;
                    *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
                    *(uint *)((long)pvVar1 + 0x10328c) = uVar5;
                  }
                  if (local_38 != 0) {
                    pvVar1 = nva_cards[local_3c]->bar0;
                    *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
                    *(undefined4 *)((long)pvVar1 + 0x103288) = 0;
                    return 0;
                  }
                  return 0;
                }
                uVar5 = uVar5 | (uVar3 & 0xff) << ((byte)iVar2 & 0x1f);
                iVar2 = iVar2 + 8;
              } while (iVar2 != 0x20);
              lVar4 = 0x10328c;
            } while( true );
          }
          fprintf(_stderr,"Binary file %s could not be opened.\n",argv[_optind]);
        }
        else {
          main_cold_4();
        }
      }
      else {
        main_cold_5();
      }
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	int base =0;
	int start = 1;
	while ((c = getopt (argc, argv, "c:bvu")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
			    base = 0xabcd;
				break;
			case 'u':
			    start = 0;
		}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PBSP, -v for PVP\n");
		return 1;
	}
	
	if (optind >= argc) {
	    fprintf(stderr, "At least specify payload file.\n");
	    return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");
    
    if (payload == NULL) {
        fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
        return 1;
    } else {
        fprintf(stderr, "Uploading file %s.\n", argv[optind]);
    }
    
    int i;

    vuc_hold(cnum, 0);

	for (i = 0; ; i += 4) {
	    uint32_t word = 0;
	    int y;
	    int character = 0;
	    for (y = 0; y < 4; y++) {
    		character = fgetc(payload);
    		if (character == EOF) {
    		    break;
    		}
    		word |= ((unsigned char)character) << (y * 8);
    	}
    	if (y == 0) {
    	    break;
    	}
    	host_xt_wr32(cnum, XTENSA_VUC_CODE_ACCESS, word);
   		if (character == EOF) {
   		    break;
   		}
	}
	if (start) {
    	vuc_start(cnum, 0);
    }
	return 0;
}